

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void utf8_suite::test_FF_C0_80_80_80_80(void)

{
  view_type *pvVar1;
  undefined4 local_154;
  value local_150 [2];
  undefined1 local_148 [8];
  decoder_type decoder;
  char input [9];
  
  stack0xffffffffffffffef = 0x2280808080c0ff22;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            ((basic_decoder<char> *)local_148,
             (value_type (*) [9])((long)&decoder.current.scan + 0x107));
  local_150[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_148);
  local_154 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x8a8,"void utf8_suite::test_FF_C0_80_80_80_80()",local_150,&local_154);
  pvVar1 = trial::protocol::json::detail::basic_decoder<char>::literal
                     ((basic_decoder<char> *)local_148);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[3]>
            ("decoder.literal()","\"\\\"\\xFF\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x8a9,"void utf8_suite::test_FF_C0_80_80_80_80()",pvVar1,anon_var_dwarf_708a);
  return;
}

Assistant:

void test_FF_C0_80_80_80_80()
{
    const char input[] = "\"\xFF\xC0\x80\x80\x80\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xFF");
}